

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::Impl::tryTransferChild
          (Impl *this,EntryImpl *entry,Type type,
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>
          *lastModified,Maybe<unsigned_long> *size,Directory *fromDirectory,PathPtr fromPath,
          TransferMode mode)

{
  undefined8 *puVar1;
  PathPtr fromPath_00;
  undefined8 *puVar2;
  File *pFVar3;
  InMemoryDirectory *pIVar4;
  String *pSVar5;
  size_t sVar6;
  bool bVar7;
  int iVar8;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>_2
  aVar9;
  long lVar10;
  long lVar11;
  Disposer *pDVar12;
  Directory *pDVar13;
  Disposer *pDVar14;
  unsigned_long uVar15;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> OVar16;
  StringPtr name;
  Own<kj::File> copy;
  ArrayDisposer *local_148;
  undefined8 *puStack_140;
  anon_union_32_2_a774ebf0_for_OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>_3
  local_138;
  Own<const_kj::File> local_118;
  undefined8 *local_108;
  OwnOwn<const_kj::Directory> subdir;
  OwnOwn<const_kj::File> file;
  char *local_d8;
  undefined8 *puStack_d0;
  OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
  local_c0;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> copy_1;
  Path filename;
  Maybe<unsigned_long> local_50;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_> local_40;
  
  if (type == SYMLINK) {
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xc])
              (&copy,fromDirectory,fromPath.parts.ptr);
    puVar2 = puStack_140;
    file.value.disposer = (Disposer *)CONCAT71(file.value.disposer._1_7_,(char)copy.disposer);
    if ((char)copy.disposer == '\x01') {
      file.value.ptr = copy.ptr;
      copy.ptr = (File *)0x0;
      aVar9 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>_2
               )(*(code *)**(undefined8 **)this->clock)();
      pFVar3 = file.value.ptr;
      if ((lastModified->ptr).isSet == true) {
        aVar9 = (lastModified->ptr).field_1;
      }
      copy.ptr = file.value.ptr;
      file.value.ptr = (File *)0x0;
      local_d8 = (char *)0x0;
      copy.disposer = (Disposer *)aVar9;
      if ((entry->node).tag != 0) {
        OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
        ::destroy(&entry->node);
      }
      (entry->node).field_1.forceAligned = (void *)aVar9;
      *(File **)((long)&(entry->node).field_1 + 8) = pFVar3;
      *(ArrayDisposer **)((long)&(entry->node).field_1 + 0x10) = local_148;
      *(undefined8 **)((long)&(entry->node).field_1 + 0x18) = puStack_140;
      copy.ptr = (File *)0x0;
      (entry->node).tag = 3;
      bVar7 = true;
      if ((mode != MOVE) ||
         (iVar8 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                            (fromDirectory,fromPath.parts.ptr,fromPath.parts.size_),
         (char)iVar8 != '\0')) goto LAB_00219ed4;
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                ((Fault *)&copy,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x61b,FAILED,"fromDirectory.tryRemove(fromPath)",
                 "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",&fromPath)
      ;
      _::Debug::Fault::~Fault((Fault *)&copy);
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                ((Fault *)&copy,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x621,FAILED,(char *)0x0,
                 "\"source node deleted concurrently during transfer\", fromPath",
                 (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
      _::Debug::Fault::~Fault((Fault *)&copy);
      puVar2 = puStack_d0;
    }
    bVar7 = false;
LAB_00219ed4:
    pFVar3 = file.value.ptr;
    if (((char)file.value.disposer == '\x01') && (file.value.ptr != (File *)0x0)) {
      file.value.ptr = (File *)0x0;
      (**(code **)*puVar2)(puVar2,pFVar3,1,local_d8,local_d8,0);
    }
    return bVar7;
  }
  if (type == DIRECTORY) {
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
              (&file,fromDirectory,fromPath.parts.ptr);
    pFVar3 = file.value.ptr;
    subdir.value.disposer = file.value.disposer;
    subdir.value.ptr = (Directory *)file.value.ptr;
    if (file.value.ptr == (File *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                ((Fault *)&file,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x612,FAILED,(char *)0x0,
                 "\"source node deleted concurrently during transfer\", fromPath",
                 (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
      _::Debug::Fault::~Fault((Fault *)&file);
LAB_00219f53:
      bVar7 = false;
    }
    else {
      if (mode == MOVE) {
        iVar8 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                          (fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
        if ((char)iVar8 == '\0') {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                    ((Fault *)&file,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x60a,FAILED,"fromDirectory.tryRemove(fromPath)",
                     "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",
                     &fromPath);
          _::Debug::Fault::~Fault((Fault *)&file);
          goto LAB_00219f53;
        }
      }
      else if (mode == COPY) {
        OVar16 = atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
                           ((kj *)&copy_1,this->clock);
        pIVar4 = copy_1.ptr;
        (*(pFVar3->super_ReadableFile).super_FsNode._vptr_FsNode[7])(&local_118,pFVar3,OVar16.ptr);
        pDVar14 = local_118.disposer;
        if (local_118.ptr != (File *)0x0) {
          lVar10 = (long)local_118.ptr << 5;
          lVar11 = 0;
          do {
            copy.disposer = *(Disposer **)((long)&pDVar14[1]._vptr_Disposer + lVar11);
            copy.ptr = *(File **)((long)&pDVar14[2]._vptr_Disposer + lVar11);
            puVar1 = *(undefined8 **)((long)&pDVar14[3]._vptr_Disposer + lVar11);
            puVar2 = (undefined8 *)((long)&pDVar14[1]._vptr_Disposer + lVar11);
            *puVar2 = 0;
            puVar2[1] = 0;
            pDVar12 = copy.disposer;
            if (copy.ptr == (File *)0x0) {
              pDVar12 = (Disposer *)0x22a50f;
            }
            puStack_140 = (undefined8 *)((ulong)puStack_140 & 0xffffffff00000000);
            name.content.size_ =
                 (long)&((copy.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode +
                 (ulong)(copy.ptr == (File *)0x0);
            name.content.ptr = (char *)pDVar12;
            Path::Path(&filename,name);
            local_40.ptr.isSet = false;
            local_50.ptr.isSet = false;
            fromPath_00.parts.size_ = filename.parts.size_;
            fromPath_00.parts.ptr = filename.parts.ptr;
            bVar7 = tryTransferChild(&(pIVar4->impl).value,(EntryImpl *)&copy,
                                     *(Type *)((long)&pDVar14->_vptr_Disposer + lVar11),&local_40,
                                     &local_50,subdir.value.ptr,fromPath_00,COPY);
            pFVar3 = copy.ptr;
            pDVar12 = copy.disposer;
            if (bVar7) {
              file.value.disposer = copy.disposer;
              if (copy.ptr == (File *)0x0) {
                file.value.disposer = (Disposer *)0x22a50f;
              }
              file.value.ptr =
                   (File *)((long)&((copy.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode +
                           (ulong)(copy.ptr == (File *)0x0));
              copy.disposer = (Disposer *)0x0;
              copy.ptr = (File *)0x0;
              local_c0.tag = (uint)puStack_140;
              if ((uint)puStack_140 == 3) {
                local_c0.field_1.forceAligned = local_138.forceAligned;
                local_c0.field_1._8_8_ = local_138._8_8_;
                local_c0.field_1._16_8_ = local_138._16_8_;
                local_c0.field_1._24_8_ = local_138._24_8_;
                local_138._8_8_ = 0;
                local_138._16_8_ = 0;
              }
              else if (((uint)puStack_140 == 2) || ((uint)puStack_140 == 1)) {
                local_c0.field_1.forceAligned = local_138.forceAligned;
                local_c0.field_1._8_8_ = local_138._8_8_;
                local_138._8_8_ = 0;
              }
              std::
              map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
              ::
              insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                        ((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                          *)&(pIVar4->impl).value.entries,
                         (pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                          *)&file);
              OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
              ::destroy(&local_c0);
              if (pDVar12 != (Disposer *)0x0) {
                (**(code **)*puVar1)(puVar1,pDVar12,1,pFVar3,pFVar3,0);
              }
            }
            else if (_::Debug::minSeverity < 3) {
              _::Debug::log<char_const(&)[62],kj::Path&>
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                         ,0x601,ERROR,
                         "\"couldn\'t copy node of type not supported by InMemoryDirectory\", filename"
                         ,(char (*) [62])
                          "couldn\'t copy node of type not supported by InMemoryDirectory",&filename
                        );
            }
            sVar6 = filename.parts.size_;
            pSVar5 = filename.parts.ptr;
            if (filename.parts.ptr != (String *)0x0) {
              filename.parts.ptr = (String *)0x0;
              filename.parts.size_ = 0;
              (**(filename.parts.disposer)->_vptr_ArrayDisposer)
                        (filename.parts.disposer,pSVar5,0x18,sVar6,sVar6,
                         ArrayDisposer::Dispose_<kj::String,_false>::destruct);
            }
            OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                       *)&puStack_140);
            pFVar3 = copy.ptr;
            pDVar12 = copy.disposer;
            if (copy.disposer != (Disposer *)0x0) {
              copy.disposer = (Disposer *)0x0;
              copy.ptr = (File *)0x0;
              (**(code **)*puVar1)(puVar1,pDVar12,1,pFVar3,pFVar3,0);
            }
            lVar11 = lVar11 + 0x20;
          } while (lVar10 != lVar11);
        }
        pFVar3 = local_118.ptr;
        pDVar14 = local_118.disposer;
        if (local_118.disposer != (Disposer *)0x0) {
          local_118.disposer = (Disposer *)0x0;
          local_118.ptr = (File *)0x0;
          (**(code **)*local_108)
                    (local_108,pDVar14,0x20,pFVar3,pFVar3,
                     ArrayDisposer::Dispose_<kj::ReadableDirectory::Entry,_false>::destruct);
        }
        file.value.disposer = copy_1.disposer;
        file.value.ptr = (File *)copy_1.ptr;
        copy_1.ptr = (InMemoryDirectory *)0x0;
        EntryImpl::set(entry,(Own<const_kj::Directory> *)&file);
        pFVar3 = file.value.ptr;
        if (file.value.ptr != (File *)0x0) {
          file.value.ptr = (File *)0x0;
          (**(file.value.disposer)->_vptr_Disposer)
                    (file.value.disposer,
                     (pFVar3->super_ReadableFile).super_FsNode._vptr_FsNode[-2] +
                     (long)&(pFVar3->super_ReadableFile).super_FsNode._vptr_FsNode);
        }
        bVar7 = true;
        goto LAB_00219fbb;
      }
      bVar7 = true;
      EntryImpl::set(entry,&subdir.value);
    }
LAB_00219fbb:
    pDVar13 = subdir.value.ptr;
    if (subdir.value.ptr == (Directory *)0x0) {
      return bVar7;
    }
    subdir.value.ptr = (Directory *)0x0;
    pDVar14 = subdir.value.disposer;
    goto LAB_0021a018;
  }
  if (type != FILE) {
    return false;
  }
  (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
            (&copy,fromDirectory,fromPath.parts.ptr);
  pFVar3 = copy.ptr;
  file.value.disposer = copy.disposer;
  file.value.ptr = copy.ptr;
  if (copy.ptr == (File *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
              ((Fault *)&copy,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x5f2,FAILED,(char *)0x0,
               "\"source node deleted concurrently during transfer\", fromPath",
               (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
    _::Debug::Fault::~Fault((Fault *)&copy);
LAB_00219f8c:
    bVar7 = false;
  }
  else {
    if (mode == MOVE) {
      iVar8 = (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x16])
                        (fromDirectory,fromPath.parts.ptr,fromPath.parts.size_);
      if ((char)iVar8 == '\0') {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                  ((Fault *)&copy,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x5ea,FAILED,"fromDirectory.tryRemove(fromPath)",
                   "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",
                   &fromPath);
        _::Debug::Fault::~Fault((Fault *)&copy);
        goto LAB_00219f8c;
      }
    }
    else if (mode == COPY) {
      newInMemoryFile((kj *)&copy,this->clock);
      uVar15 = 0xffffffffffffffff;
      if ((size->ptr).isSet == true) {
        uVar15 = (size->ptr).field_1.value;
      }
      (*((copy.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[0xd])(copy.ptr,0,pFVar3,0,uVar15)
      ;
      local_118.disposer = copy.disposer;
      local_118.ptr = copy.ptr;
      copy.ptr = (File *)0x0;
      EntryImpl::set(entry,&local_118);
      pFVar3 = local_118.ptr;
      if (local_118.ptr != (File *)0x0) {
        local_118.ptr = (File *)0x0;
        (**(local_118.disposer)->_vptr_Disposer)
                  (local_118.disposer,
                   (pFVar3->super_ReadableFile).super_FsNode._vptr_FsNode[-2] +
                   (long)&(pFVar3->super_ReadableFile).super_FsNode._vptr_FsNode);
      }
      bVar7 = true;
      goto LAB_0021a000;
    }
    bVar7 = true;
    EntryImpl::set(entry,&file.value);
  }
LAB_0021a000:
  pDVar13 = (Directory *)file.value.ptr;
  if (file.value.ptr == (File *)0x0) {
    return bVar7;
  }
  file.value.ptr = (File *)0x0;
  pDVar14 = file.value.disposer;
LAB_0021a018:
  (**pDVar14->_vptr_Disposer)
            (pDVar14,(pDVar13->super_ReadableDirectory).super_FsNode._vptr_FsNode[-2] +
                     (long)&(pDVar13->super_ReadableDirectory).super_FsNode._vptr_FsNode);
  return bVar7;
}

Assistant:

bool tryTransferChild(EntryImpl& entry, const FsNode::Type type, kj::Maybe<Date> lastModified,
                          kj::Maybe<uint64_t> size, const Directory& fromDirectory,
                          PathPtr fromPath, TransferMode mode) {
      switch (type) {
        case FsNode::Type::FILE:
          KJ_IF_MAYBE(file, fromDirectory.tryOpenFile(fromPath, WriteMode::MODIFY)) {
            if (mode == TransferMode::COPY) {
              auto copy = newInMemoryFile(clock);
              copy->copy(0, **file, 0, size.orDefault(kj::maxValue));
              entry.set(kj::mv(copy));
            } else {
              if (mode == TransferMode::MOVE) {
                KJ_ASSERT(fromDirectory.tryRemove(fromPath), "couldn't move node", fromPath) {
                  return false;
                }
              }
              entry.set(kj::mv(*file));
            }
            return true;
          } else {
            KJ_FAIL_ASSERT("source node deleted concurrently during transfer", fromPath) {
              return false;
            }
          }